

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O1

SharedPtr __thiscall
deqp::gles31::Functional::anon_unknown_0::generateRandomVariableDefinition
          (anon_unknown_0 *this,Random *rnd,SharedPtr *parentStructure,DataType baseType,
          Layout *layout,bool allowUnsized)

{
  deInt32 *pdVar1;
  int iVar2;
  Node *pNVar3;
  SharedPtrStateBase *pSVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  SharedPtrStateBase *extraout_RDX;
  SharedPtrStateBase *extraout_RDX_00;
  SharedPtrStateBase *extraout_RDX_01;
  int iVar7;
  float fVar8;
  SharedPtr SVar9;
  SharedPtr currentStructure;
  Node *local_50;
  SharedPtrStateBase *local_48;
  
  local_50 = parentStructure->m_ptr;
  local_48 = parentStructure->m_state;
  if (local_48 != (SharedPtrStateBase *)0x0) {
    LOCK();
    local_48->strongRefCount = local_48->strongRefCount + 1;
    UNLOCK();
    LOCK();
    local_48->weakRefCount = local_48->weakRefCount + 1;
    UNLOCK();
  }
  iVar2 = layout->binding;
  iVar7 = 4;
  do {
    if ((iVar7 != 4 || !allowUnsized) || (fVar8 = deRandom_getFloat(&rnd->m_rnd), 0.2 <= fVar8)) {
      fVar8 = deRandom_getFloat(&rnd->m_rnd);
      if (fVar8 < 0.3 &&
          (iVar2 == -1 && (baseType != TYPE_UINT_ATOMIC_COUNTER && 0xd < baseType - TYPE_IMAGE_2D)))
      {
        pNVar3 = (Node *)operator_new(0x20);
        pNVar3->_vptr_Node = (_func_int **)&PTR__Node_00b52778;
        pNVar3->m_type = TYPE_STRUCT_MEMBER;
        (pNVar3->m_enclosingNode).m_ptr = local_50;
        (pNVar3->m_enclosingNode).m_state = local_48;
        if (local_48 != (SharedPtrStateBase *)0x0) {
          LOCK();
          local_48->strongRefCount = local_48->strongRefCount + 1;
          UNLOCK();
          LOCK();
          pdVar1 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
          *pdVar1 = *pdVar1 + 1;
          UNLOCK();
        }
        pNVar3->_vptr_Node = (_func_int **)&PTR__Node_00b52978;
        pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
      }
      else {
        fVar8 = deRandom_getFloat(&rnd->m_rnd);
        if (0.3 <= fVar8) break;
        pNVar3 = (Node *)operator_new(0x28);
        pNVar3->_vptr_Node = (_func_int **)&PTR__Node_00b52778;
        pNVar3->m_type = TYPE_ARRAY_ELEMENT;
        (pNVar3->m_enclosingNode).m_ptr = local_50;
        (pNVar3->m_enclosingNode).m_state = local_48;
        if (local_48 != (SharedPtrStateBase *)0x0) {
          LOCK();
          local_48->strongRefCount = local_48->strongRefCount + 1;
          UNLOCK();
          LOCK();
          pdVar1 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
          *pdVar1 = *pdVar1 + 1;
          UNLOCK();
        }
        pNVar3->_vptr_Node = (_func_int **)&PTR__Node_00b528b8;
        *(undefined4 *)&pNVar3[1]._vptr_Node = 0xffffffff;
        pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
      }
    }
    else {
      pNVar3 = (Node *)operator_new(0x28);
      pNVar3->_vptr_Node = (_func_int **)&PTR__Node_00b52778;
      pNVar3->m_type = TYPE_ARRAY_ELEMENT;
      (pNVar3->m_enclosingNode).m_ptr = local_50;
      (pNVar3->m_enclosingNode).m_state = local_48;
      if (local_48 != (SharedPtrStateBase *)0x0) {
        LOCK();
        local_48->strongRefCount = local_48->strongRefCount + 1;
        UNLOCK();
        LOCK();
        pdVar1 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
        *pdVar1 = *pdVar1 + 1;
        UNLOCK();
      }
      pNVar3->_vptr_Node = (_func_int **)&PTR__Node_00b528b8;
      *(undefined4 *)&pNVar3[1]._vptr_Node = 0xfffffffe;
      pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
    }
    pSVar4->strongRefCount = 0;
    pSVar4->weakRefCount = 0;
    pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b52798;
    pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
    pSVar4->strongRefCount = 1;
    pSVar4->weakRefCount = 1;
    if (local_48 != pSVar4) {
      if (local_48 != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &local_48->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          (*local_48->_vptr_SharedPtrStateBase[2])();
        }
        LOCK();
        pdVar1 = &local_48->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if ((*pdVar1 == 0) && (local_48 != (SharedPtrStateBase *)0x0)) {
          (*local_48->_vptr_SharedPtrStateBase[1])();
        }
      }
      LOCK();
      pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pSVar4->weakRefCount = pSVar4->weakRefCount + 1;
      UNLOCK();
      local_50 = pNVar3;
      local_48 = pSVar4;
    }
    LOCK();
    pdVar1 = &pSVar4->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      (*pSVar4->_vptr_SharedPtrStateBase[2])(pSVar4);
    }
    LOCK();
    pdVar1 = &pSVar4->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      (*pSVar4->_vptr_SharedPtrStateBase[1])(pSVar4);
    }
    iVar7 = iVar7 + -1;
  } while (iVar7 != 0);
  puVar5 = (undefined8 *)operator_new(0x28);
  *puVar5 = &PTR__Node_00b52778;
  *(undefined4 *)(puVar5 + 1) = 3;
  puVar5[2] = local_50;
  puVar5[3] = local_48;
  if (local_48 != (SharedPtrStateBase *)0x0) {
    LOCK();
    local_48->strongRefCount = local_48->strongRefCount + 1;
    UNLOCK();
    LOCK();
    *(int *)(puVar5[3] + 0xc) = *(int *)(puVar5[3] + 0xc) + 1;
    UNLOCK();
  }
  *puVar5 = &PTR__Node_00b528f0;
  *(DataType *)(puVar5 + 4) = baseType;
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 **)this = puVar5;
  puVar6 = (undefined8 *)operator_new(0x20);
  *(undefined4 *)(puVar6 + 1) = 0;
  *(undefined4 *)((long)puVar6 + 0xc) = 0;
  *puVar6 = &PTR__SharedPtrState_00b52798;
  puVar6[2] = puVar5;
  *(undefined8 **)(this + 8) = puVar6;
  *(undefined4 *)(puVar6 + 1) = 1;
  *(undefined4 *)((long)puVar6 + 0xc) = 1;
  pSVar4 = extraout_RDX;
  if (local_48 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &local_48->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      (*local_48->_vptr_SharedPtrStateBase[2])();
      pSVar4 = extraout_RDX_00;
    }
    LOCK();
    pdVar1 = &local_48->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) && (local_48 != (SharedPtrStateBase *)0x0)) {
      (*local_48->_vptr_SharedPtrStateBase[1])();
      pSVar4 = extraout_RDX_01;
    }
  }
  SVar9.m_state = pSVar4;
  SVar9.m_ptr = (Node *)this;
  return SVar9;
}

Assistant:

static ResourceDefinition::Node::SharedPtr generateRandomVariableDefinition (de::Random&								rnd,
																			 const ResourceDefinition::Node::SharedPtr&	parentStructure,
																			 glu::DataType								baseType,
																			 const glu::Layout&							layout,
																			 bool										allowUnsized)
{
	const int							maxNesting			= 4;
	ResourceDefinition::Node::SharedPtr	currentStructure	= parentStructure;
	const bool							canBeInsideAStruct	= layout.binding == -1 && !isDataTypeLayoutQualified(baseType);

	for (int nestNdx = 0; nestNdx < maxNesting; ++nestNdx)
	{
		if (allowUnsized && nestNdx == 0 && rnd.getFloat() < 0.2)
			currentStructure = ResourceDefinition::Node::SharedPtr(new ResourceDefinition::ArrayElement(currentStructure, ResourceDefinition::ArrayElement::UNSIZED_ARRAY));
		else if (rnd.getFloat() < 0.3 && canBeInsideAStruct)
			currentStructure = ResourceDefinition::Node::SharedPtr(new ResourceDefinition::StructMember(currentStructure));
		else if (rnd.getFloat() < 0.3)
			currentStructure = ResourceDefinition::Node::SharedPtr(new ResourceDefinition::ArrayElement(currentStructure));
		else
			break;
	}

	return ResourceDefinition::Node::SharedPtr(new ResourceDefinition::Variable(currentStructure, baseType));
}